

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *rhs)

{
  LogMessage *other;
  tuple<google::protobuf::Arena_*&,_int_&,_int_&,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*&>
  local_d8;
  tuple<google::protobuf::Arena_*&,_int_&,_int_&,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*&>
  local_b8;
  tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  local_98;
  undefined1 local_80 [8];
  tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  temp;
  LogMessage local_50;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *rhs_local;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  if (this == rhs) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x6f7);
    other = LogMessage::operator<<(&local_50,"CHECK failed: this != rhs: ");
    LogFinisher::operator=
              ((LogFinisher *)
               ((long)&temp.
                       super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
                       .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl + 3),
               other);
    LogMessage::~LogMessage(&local_50);
  }
  std::
  make_tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
            ((tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
              *)local_80,&local_18->arena_,&local_18->current_size_,&local_18->total_size_,
             &local_18->rep_);
  std::
  make_tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
            (&local_98,&this->arena_,&this->current_size_,&this->total_size_,&this->rep_);
  std::tie<google::protobuf::Arena*,int,int,google::protobuf::internal::RepeatedPtrFieldBase::Rep*>
            (&local_b8,&local_18->arena_,&local_18->current_size_,&local_18->total_size_,
             &local_18->rep_);
  std::
  tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
  ::operator=((tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
               *)&local_b8,&local_98);
  std::tie<google::protobuf::Arena*,int,int,google::protobuf::internal::RepeatedPtrFieldBase::Rep*>
            (&local_d8,&this->arena_,&this->current_size_,&this->total_size_,&this->rep_);
  std::
  tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
  ::operator=((tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
               *)&local_d8,
              (tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
               *)local_80);
  return;
}

Assistant:

void RepeatedPtrFieldBase::InternalSwap(RepeatedPtrFieldBase* rhs) {
  GOOGLE_DCHECK(this != rhs);

  // Swap all fields at once.
  auto temp = std::make_tuple(rhs->arena_, rhs->current_size_, rhs->total_size_,
                              rhs->rep_);
  std::tie(rhs->arena_, rhs->current_size_, rhs->total_size_, rhs->rep_) =
      std::make_tuple(arena_, current_size_, total_size_, rep_);
  std::tie(arena_, current_size_, total_size_, rep_) = temp;
}